

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::ReturnCallIndirectExpr::ReturnCallIndirectExpr(ReturnCallIndirectExpr *this,Location *loc)

{
  Location local_38;
  Location *local_18;
  Location *loc_local;
  ReturnCallIndirectExpr *this_local;
  
  local_18 = loc;
  loc_local = (Location *)this;
  ExprMixin<(wabt::ExprType)39>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)39>,loc);
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__ReturnCallIndirectExpr_0049ce58;
  FuncDeclaration::FuncDeclaration(&this->decl);
  Location::Location(&local_38);
  Var::Var(&this->table,0xffffffff,&local_38);
  return;
}

Assistant:

explicit ReturnCallIndirectExpr(const Location &loc = Location())
      : ExprMixin<ExprType::ReturnCallIndirect>(loc) {}